

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

void I_NetCmd(void)

{
  FStartupScreen *pFVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uStack_50;
  FString FStack_40;
  undefined8 uStack_38;
  socklen_t sStack_2c;
  sockaddr_in sStack_28;
  
  if (doomcom.command != 2) {
    if (doomcom.command != 1) {
      I_Error("Bad net cmd: %i\n",(ulong)(uint)(int)doomcom.command);
      return;
    }
    PacketSend();
    return;
  }
  sStack_2c = 0x10;
  uStack_50 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)&sStack_28,&sStack_2c);
  uVar2 = FindNode(&sStack_28);
  iVar3 = (int)uStack_50;
  if (iVar3 == -1 && -1 < (int)uVar2) {
    piVar4 = __errno_location();
    pFVar1 = StartScreen;
    iVar3 = *piVar4;
    if (iVar3 == 0xb) {
      doomcom.remotenode = -1;
      return;
    }
    if (iVar3 == 0x68) {
      pcVar5 = userinfo_t::GetName((userinfo_t *)(&DAT_009ba458 + (ulong)sendplayer[uVar2] * 0x2a0))
      ;
      if (pFVar1 == (FStartupScreen *)0x0) {
        Printf("The connection from %s was dropped.\n",pcVar5);
      }
      else {
        (*pFVar1->_vptr_FStartupScreen[7])(pFVar1,"The connection from %s was dropped.\n",pcVar5);
      }
      doomcom.data[0] = 0x80;
      uStack_50 = 1;
    }
    else {
      pcVar5 = strerror(iVar3);
      I_Error("GetPacket: %s",pcVar5);
      uStack_50 = 0xffffffffffffffff;
    }
  }
  else if (iVar3 < 1 || (int)uVar2 < 0) {
    if (0 < iVar3) {
      if (((iVar3 == 2) && (TransmitBuffer[0] == '0')) && (TransmitBuffer[1] == '\x02')) {
        doomcom.remotenode = -1;
        return;
      }
      pcVar5 = inet_ntoa((in_addr)sStack_28.sin_addr.s_addr);
      DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar5,(ulong)sStack_28.sin_port);
      doomcom.remotenode = -1;
      return;
    }
  }
  else {
    doomcom.data[0] = TransmitBuffer[0] & 0xfb;
    if ((TransmitBuffer[0] & 4) == 0) {
      memcpy(doomcom.data + 1,TransmitBuffer + 1,(ulong)(iVar3 - 1));
    }
    else {
      uStack_38 = 13999;
      iVar3 = uncompress(0x9abf45,&uStack_38,TransmitBuffer + 1,iVar3 + -1);
      if (iVar3 != 0) {
        M_ZLibError((int)&FStack_40);
        Printf("Net decompression failed (zlib error %s)\n",FStack_40.Chars);
        FString::~FString(&FStack_40);
        doomcom.remotenode = -1;
        return;
      }
      uStack_50 = (ulong)((int)uStack_38 + 1);
    }
  }
  doomcom.datalength = (SWORD)uStack_50;
  doomcom.remotenode = (SWORD)uVar2;
  return;
}

Assistant:

void I_NetCmd (void)
{
	if (doomcom.command == CMD_SEND)
	{
		PacketSend ();
	}
	else if (doomcom.command == CMD_GET)
	{
		PacketGet ();
	}
	else
		I_Error ("Bad net cmd: %i\n",doomcom.command);
}